

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_multiclasstask.cc
# Opt level: O2

void MulticlassTask::initialize(search *sch,size_t *num_actions,options_i *param_3)

{
  unsigned_long __x;
  unsigned_long *puVar1;
  __type_conflict _Var2;
  double dVar3;
  uint local_28 [2];
  
  puVar1 = (unsigned_long *)operator_new(0x30);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  Search::search::set_options(sch,0);
  Search::search::set_num_learners(sch,*num_actions);
  __x = *num_actions;
  *puVar1 = __x;
  _Var2 = std::log<unsigned_long>(__x);
  dVar3 = ceil(_Var2 / 0.6931471805599453);
  puVar1[1] = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
  local_28[1] = 1;
  v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(puVar1 + 2),local_28 + 1);
  local_28[0] = 2;
  v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(puVar1 + 2),local_28);
  sch->task_data = puVar1;
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, VW::config::options_i& /*vm*/)
{
  task_data* my_task_data = new task_data();
  sch.set_options(0);
  sch.set_num_learners(num_actions);
  my_task_data->max_label = num_actions;
  my_task_data->num_level = (size_t)ceil(log(num_actions) / log(2));
  my_task_data->y_allowed.push_back(1);
  my_task_data->y_allowed.push_back(2);
  sch.set_task_data(my_task_data);
}